

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PackedArray.c
# Opt level: O1

void PackedArray_set(PackedArray *a,uint32_t offset,uint32_t in)

{
  uint uVar1;
  uint uVar2;
  sbyte sVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  
  if (a == (PackedArray *)0x0) {
    __assert_fail("a != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ivan2kh[P]sort-big-file-with-a-limited-memory/PackedArray.c"
                  ,0x1fc,"void PackedArray_set(PackedArray *, const uint32_t, const uint32_t)");
  }
  uVar1 = a->bitsPerItem;
  uVar6 = (int)(1L << ((byte)uVar1 & 0x3f)) - 1;
  if (in <= uVar6) {
    uVar7 = (ulong)offset * (ulong)uVar1 >> 5;
    uVar2 = (uint)((ulong)offset * (ulong)uVar1) & 0x1f;
    uVar5 = 0x20 - uVar2;
    sVar3 = (sbyte)uVar2;
    if (uVar5 < uVar1) {
      bVar4 = (byte)uVar5;
      a[1].padding[uVar7 - 2] = ~(uVar6 << sVar3) & a[1].padding[uVar7 - 2] | in << sVar3;
      a[1].padding[uVar7 - 1] =
           ~(uVar6 >> (bVar4 & 0x1f)) & a[1].padding[uVar7 - 1] | in >> (bVar4 & 0x1f);
    }
    else {
      a[1].padding[uVar7 - 2] = in << sVar3 | ~(uVar6 << sVar3) & a[1].padding[uVar7 - 2];
    }
    return;
  }
  __assert_fail("0 == (~mask & in)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ivan2kh[P]sort-big-file-with-a-limited-memory/PackedArray.c"
                ,0x206,"void PackedArray_set(PackedArray *, const uint32_t, const uint32_t)");
}

Assistant:

void PackedArray_set(PackedArray* a, const uint32_t offset, const uint32_t in)
{
  uint32_t* __restrict out;
  uint32_t bitsPerItem;
  uint32_t startBit;
  uint32_t bitsAvailable;
  uint32_t mask;

  PACKEDARRAY_ASSERT(a != NULL);

  bitsPerItem = a->bitsPerItem;

  out = &a->buffer[((uint64_t)offset * (uint64_t)bitsPerItem) / 32];
  startBit = ((uint64_t)offset * (uint64_t)bitsPerItem) % 32;

  bitsAvailable = 32 - startBit;

  mask = (uint32_t)(1ULL << bitsPerItem) - 1;
  PACKEDARRAY_ASSERT(0 == (~mask & in));

  if (bitsPerItem <= bitsAvailable)
  {
    out[0] = (out[0] & ~(mask << startBit)) | (in << startBit);
  }
  else
  {
    // value spans 2 buffer cells
    uint32_t low, high;

    low = in << startBit;
    high = in >> bitsAvailable;

    out[0] = (out[0] & ~(mask << startBit)) | low;

    out[1] = (out[1] & ~(mask >> (32 - startBit))) | high;
  }
}